

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::GetNumBindingsUsedByType
          (DescriptorScalarReplacement *this,uint32_t type_id)

{
  IRContext *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  uint32_t uVar5;
  Instruction *this_00;
  const_iterator cVar6;
  uint uVar7;
  uint uVar8;
  key_type local_24;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,type_id);
  OVar4 = this_00->opcode_;
  if (OVar4 == OpTypePointer) {
    uVar7 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar7 = (uint)this_00->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(this_00,uVar7 + 1);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    this_00 = analysis::DefUseManager::GetDef
                        ((pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,uVar3);
    OVar4 = this_00->opcode_;
  }
  uVar3 = 1;
  if (OVar4 == OpTypeStruct) {
    bVar2 = descsroautil::IsTypeOfStructuredBuffer((this->super_Pass).context_,this_00);
    if (!bVar2) {
      uVar7 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar7 = (uint)this_00->has_result_id_;
      }
      uVar3 = 0;
      if (uVar7 != (int)((ulong)((long)(this_00->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
         ) {
        uVar8 = 0;
        uVar3 = 0;
        do {
          uVar5 = Instruction::GetSingleWordOperand(this_00,uVar7 + uVar8);
          uVar5 = GetNumBindingsUsedByType(this,uVar5);
          uVar3 = uVar3 + uVar5;
          uVar8 = uVar8 + 1;
          uVar7 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar7 = (uint)this_00->has_result_id_;
          }
        } while (uVar8 < (int)((ulong)((long)(this_00->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_00->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar7);
      }
    }
  }
  else if (OVar4 == OpTypeArray) {
    uVar3 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar3 = (uint)this_00->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(this_00,uVar3);
    uVar7 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar7 = (uint)this_00->has_result_id_;
    }
    Instruction::GetSingleWordOperand(this_00,uVar7 + 1);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar1);
    }
    cVar6 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(((pIVar1->constant_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                     _M_head_impl)->id_to_const_val_)._M_h,&local_24);
    if ((cVar6.
         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (*(Constant **)
         ((long)cVar6.
                super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                ._M_cur + 0x10) == (Constant *)0x0)) {
      __assert_fail("length_const != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                    ,0x17c,
                    "uint32_t spvtools::opt::DescriptorScalarReplacement::GetNumBindingsUsedByType(uint32_t)"
                   );
    }
    uVar5 = analysis::Constant::GetU32
                      (*(Constant **)
                        ((long)cVar6.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                               ._M_cur + 0x10));
    uVar3 = GetNumBindingsUsedByType(this,uVar3);
    uVar3 = uVar3 * uVar5;
  }
  return uVar3;
}

Assistant:

uint32_t DescriptorScalarReplacement::GetNumBindingsUsedByType(
    uint32_t type_id) {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);

  // If it's a pointer, look at the underlying type.
  if (type_inst->opcode() == spv::Op::OpTypePointer) {
    type_id = type_inst->GetSingleWordInOperand(1);
    type_inst = get_def_use_mgr()->GetDef(type_id);
  }

  // Arrays consume N*M binding numbers where N is the array length, and M is
  // the number of bindings used by each array element.
  if (type_inst->opcode() == spv::Op::OpTypeArray) {
    uint32_t element_type_id = type_inst->GetSingleWordInOperand(0);
    uint32_t length_id = type_inst->GetSingleWordInOperand(1);
    const analysis::Constant* length_const =
        context()->get_constant_mgr()->FindDeclaredConstant(length_id);
    // OpTypeArray's length must always be a constant
    assert(length_const != nullptr);
    uint32_t num_elems = length_const->GetU32();
    return num_elems * GetNumBindingsUsedByType(element_type_id);
  }

  // The number of bindings consumed by a structure is the sum of the bindings
  // used by its members.
  if (type_inst->opcode() == spv::Op::OpTypeStruct &&
      !descsroautil::IsTypeOfStructuredBuffer(context(), type_inst)) {
    uint32_t sum = 0;
    for (uint32_t i = 0; i < type_inst->NumInOperands(); i++)
      sum += GetNumBindingsUsedByType(type_inst->GetSingleWordInOperand(i));
    return sum;
  }

  // All other types are considered to take up 1 binding number.
  return 1;
}